

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

IndirOpnd * __thiscall
Func::GetConstantAddressIndirOpnd
          (Func *this,intptr_t address,Opnd *largeConstOpnd,AddrOpndKind kind,IRType type,
          OpCode loadOpCode)

{
  RealCount *pRVar1;
  Opnd *this_00;
  code *pcVar2;
  Func *func;
  SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  bool bVar4;
  OpndKind OVar5;
  OpndKind OVar6;
  undefined4 *puVar7;
  Type *ppRVar8;
  _func_int **pp_Var9;
  Type pRVar10;
  Instr *instr;
  Type pSVar11;
  Instr *this_01;
  IndirOpnd *this_02;
  undefined7 in_register_00000009;
  SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *pSVar12;
  undefined7 in_register_00000081;
  undefined2 in_register_0000008a;
  AddrOpndKind kind_00;
  Iterator local_58;
  undefined4 local_48;
  undefined4 local_44;
  Func *local_40;
  undefined4 local_34;
  
  local_48 = CONCAT22(in_register_0000008a,loadOpCode);
  if (this->topFunc != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x7a4,"(this->GetTopFunc() == this)","this->GetTopFunc() == this");
    if (!bVar4) goto LAB_00430b56;
    *puVar7 = 0;
  }
  if (this->canHoistConstantAddressLoad == true) {
    local_44 = (undefined4)CONCAT71(in_register_00000081,type);
    local_34 = (undefined4)CONCAT71(in_register_00000009,kind);
    local_58.list =
         &(this->constantAddressRegOpnd).
          super_SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>;
    local_58.current = &(local_58.list)->super_SListNodeBase<Memory::ArenaAllocator>;
    local_40 = this;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if ((SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)local_58.current ==
          (SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) goto LAB_00430b56;
        *puVar7 = 0;
      }
      local_58.current =
           (((SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)
            &(local_58.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      pSVar12 = (SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      ppRVar8 = (Type *)0x0;
      pSVar3 = pSVar12;
      if ((SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)local_58.current ==
          local_58.list) goto LAB_00430a30;
      ppRVar8 = SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          (&local_58);
      pRVar10 = *ppRVar8;
      if (((pRVar10->m_sym->field_0x18 & 1) == 0) ||
         ((pRVar10->m_sym->field_5).m_instrDef == (Instr *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x7ae,"(regOpnd->m_sym->IsSingleDef())","regOpnd->m_sym->IsSingleDef()")
        ;
        if (!bVar4) goto LAB_00430b56;
        *puVar7 = 0;
      }
      OVar5 = IR::Opnd::GetKind(((pRVar10->m_sym->field_5).m_instrDef)->m_src1);
      if ((OVar5 != OpndKindAddr) &&
         (OVar5 = IR::Opnd::GetKind(((pRVar10->m_sym->field_5).m_instrDef)->m_src1),
         OVar5 != OpndKindIntConst)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x7af,
                           "(regOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd() || regOpnd->m_sym->m_instrDef->GetSrc1()->IsIntConstOpnd())"
                           ,
                           "regOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd() || regOpnd->m_sym->m_instrDef->GetSrc1()->IsIntConstOpnd()"
                          );
        if (!bVar4) goto LAB_00430b56;
        *puVar7 = 0;
      }
      OVar5 = IR::Opnd::GetKind(((pRVar10->m_sym->field_5).m_instrDef)->m_src1);
      this_00 = ((pRVar10->m_sym->field_5).m_instrDef)->m_src1;
      OVar6 = IR::Opnd::GetKind(this_00);
      if (OVar5 == OpndKindAddr) {
        if (OVar6 != OpndKindAddr) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
          if (!bVar4) goto LAB_00430b56;
          *puVar7 = 0;
        }
        pp_Var9 = this_00[2]._vptr_Opnd;
      }
      else {
        if (OVar6 != OpndKindIntConst) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
          if (!bVar4) goto LAB_00430b56;
          *puVar7 = 0;
        }
        pp_Var9 = this_00[1]._vptr_Opnd;
      }
      pSVar12 = (SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)
                (address - (long)pp_Var9);
    } while ((SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)(long)(int)pSVar12 !=
             pSVar12);
    ppRVar8 = SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_58)
    ;
    pSVar3 = (SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)local_58.current;
LAB_00430a30:
    local_58.current = &pSVar3->super_SListNodeBase<Memory::ArenaAllocator>;
    if (ppRVar8 == (Type *)0x0) {
      if ((int)pSVar12 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x7c4,"(offset == 0)","offset == 0");
        if (!bVar4) {
LAB_00430b56:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      func = local_40;
      pRVar10 = IR::RegOpnd::New(TyUint64,local_40);
      instr = IR::Instr::New((OpCode)local_48,&pRVar10->super_Opnd,largeConstOpnd,func);
      pSVar11 = (Type)new<Memory::ArenaAllocator>
                                (0x10,(func->constantAddressRegOpnd).allocator,0x366bee);
      pSVar11[1].next = (Type)pRVar10;
      pSVar11->next =
           (func->constantAddressRegOpnd).
           super_SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next;
      (func->constantAddressRegOpnd).
      super_SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar11;
      pRVar1 = &(func->constantAddressRegOpnd).
                super_SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount;
      pRVar1->count = pRVar1->count + 1;
      this_01 = func->lastConstantAddressRegLoadInstr;
      kind_00 = (AddrOpndKind)local_34;
      if (this_01 == (Instr *)0x0) {
        this_01 = GetFunctionEntryInsertionPoint(local_40);
        local_40->lastConstantAddressRegLoadInstr = instr;
      }
      IR::Instr::InsertBefore(this_01,instr);
    }
    else {
      pRVar10 = *ppRVar8;
      kind_00 = (AddrOpndKind)local_34;
    }
    this_02 = IR::IndirOpnd::New(pRVar10,(int)pSVar12,(IRType)local_44,local_40,true);
    IR::IndirOpnd::SetAddrKind(this_02,kind_00,(void *)address);
  }
  else {
    this_02 = (IndirOpnd *)0x0;
  }
  return this_02;
}

Assistant:

IR::IndirOpnd * Func::GetConstantAddressIndirOpnd(intptr_t address, IR::Opnd * largeConstOpnd, IR::AddrOpndKind kind, IRType type, Js::OpCode loadOpCode)
{
    Assert(this->GetTopFunc() == this);
    if (!canHoistConstantAddressLoad)
    {
        // We can't hoist constant address load after lower, as we can't mark the sym as
        // live on back edge
        return nullptr;
    }
    int offset = 0;
    IR::RegOpnd ** foundRegOpnd = this->constantAddressRegOpnd.Find([address, &offset](IR::RegOpnd * regOpnd)
    {
        Assert(regOpnd->m_sym->IsSingleDef());
        Assert(regOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd() || regOpnd->m_sym->m_instrDef->GetSrc1()->IsIntConstOpnd());
        void * curr = regOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd() ?
                      regOpnd->m_sym->m_instrDef->GetSrc1()->AsAddrOpnd()->m_address :
                      (void *)regOpnd->m_sym->m_instrDef->GetSrc1()->AsIntConstOpnd()->GetValue();
        ptrdiff_t diff = (uintptr_t)address - (uintptr_t)curr;
        if (!Math::FitsInDWord(diff))
        {
            return false;
        }

        offset = (int)diff;
        return true;
    });

    IR::RegOpnd * addressRegOpnd;
    if (foundRegOpnd != nullptr)
    {
        addressRegOpnd = *foundRegOpnd;
    }
    else
    {
        Assert(offset == 0);
        addressRegOpnd = IR::RegOpnd::New(TyMachPtr, this);
        IR::Instr *const newInstr =
            IR::Instr::New(
            loadOpCode,
            addressRegOpnd,
            largeConstOpnd,
            this);
        this->constantAddressRegOpnd.Prepend(addressRegOpnd);

        IR::Instr * insertBeforeInstr = this->lastConstantAddressRegLoadInstr;
        if (insertBeforeInstr == nullptr)
        {
            insertBeforeInstr = this->GetFunctionEntryInsertionPoint();
            this->lastConstantAddressRegLoadInstr = newInstr;
        }
        insertBeforeInstr->InsertBefore(newInstr);
    }
    IR::IndirOpnd * indirOpnd =  IR::IndirOpnd::New(addressRegOpnd, offset, type, this, true);
#if DBG_DUMP
    // TODO: michhol make intptr_t
    indirOpnd->SetAddrKind(kind, (void*)address);
#endif
    return indirOpnd;
}